

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

void igPlotHistogramFloatPtr
               (char *label,float *values,int values_count,int values_offset,char *overlay_text,
               float scale_min,float scale_max,ImVec2 graph_size,int stride)

{
  ImGui::PlotHistogram
            (label,values,values_count,values_offset,overlay_text,scale_min,scale_max,graph_size,
             stride);
  return;
}

Assistant:

CIMGUI_API void _igPlotHistogramFloatPtr (char *larg1, float *larg2, int larg3, int larg4, char *larg5, float larg6, float larg7, ImVec2 *larg8, int larg9) {
  char *arg1 = (char *) 0 ;
  float *arg2 = (float *) 0 ;
  int arg3 ;
  int arg4 ;
  char *arg5 = (char *) 0 ;
  float arg6 ;
  float arg7 ;
  ImVec2 arg8 ;
  int arg9 ;
  
  arg1 = larg1;
  arg2 = larg2;
  arg3 = larg3;
  arg4 = larg4;
  arg5 = larg5;
  arg6 = larg6;
  arg7 = larg7;
  arg8 = *larg8;
  arg9 = larg9;
  try {
    igPlotHistogramFloatPtr((char const *)arg1,(float const *)arg2,arg3,arg4,(char const *)arg5,arg6,arg7,arg8,arg9);
    
  } catch (...) {
    
  }
}